

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void SDL_GL_UpdateRects(int numrects,SDL12_Rect *rects12)

{
  ushort uVar1;
  SDL20_IntersectRect_t p_Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  GLenum GVar6;
  GLenum GVar7;
  int iVar8;
  int iVar9;
  SDL_Rect *pSVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  GLint vert_y2;
  GLint vert_x2;
  GLint vert_y1;
  GLint vert_x1;
  GLfloat tex_y2;
  GLfloat tex_x2;
  GLfloat tex_y1;
  GLfloat tex_x1;
  Uint8 *src;
  int local_60;
  SDL_Rect intersected20;
  SDL_Rect rect20;
  int i;
  SDL_Rect surfacerect20;
  GLenum gltype;
  GLenum glfmt;
  int pixsize;
  int srcpitch;
  SDL12_Rect *rects12_local;
  int numrects_local;
  
  if (OpenGLBlitTexture != 0) {
    uVar1 = VideoSurface12->pitch;
    uVar5 = (uint)VideoSurface12->format->BytesPerPixel;
    GVar6 = 0x1907;
    if (uVar5 == 4) {
      GVar6 = 0x1908;
    }
    GVar7 = 0x8363;
    if (uVar5 == 4) {
      GVar7 = 0x1401;
    }
    rect20.h = 0;
    for (rect20.w = 0; p_Var2 = SDL20_IntersectRect, rect20.w < numrects; rect20.w = rect20.w + 1) {
      pSVar10 = Rect12to20(rects12 + rect20.w,(SDL_Rect *)&intersected20.w);
      (*p_Var2)(pSVar10,(SDL_Rect *)&rect20.h,(SDL_Rect *)((long)&src + 4));
      (*OpenGLFuncs.glTexSubImage2D)
                (0xde1,0,src._4_4_,local_60,intersected20.x,intersected20.y,GVar6,GVar7,
                 (GLvoid *)
                 ((long)VideoSurface12->pixels +
                 (long)(int)(src._4_4_ * uVar5) + (long)(int)(local_60 * (uint)uVar1)));
      (*OpenGLFuncs.glBegin)(5);
      iVar4 = local_60;
      iVar3 = src._4_4_;
      fVar11 = (float)src._4_4_ / (float)VideoSurface12->w;
      fVar12 = (float)local_60 / (float)VideoSurface12->h;
      fVar13 = fVar11 + (float)intersected20.x / (float)VideoSurface12->w;
      fVar14 = fVar12 + (float)intersected20.y / (float)VideoSurface12->h;
      iVar8 = src._4_4_ + intersected20.x;
      iVar9 = local_60 + intersected20.y;
      (*OpenGLFuncs.glTexCoord2f)(fVar11,fVar12);
      (*OpenGLFuncs.glVertex2i)(iVar3,iVar4);
      (*OpenGLFuncs.glTexCoord2f)(fVar13,fVar12);
      (*OpenGLFuncs.glVertex2i)(iVar8,iVar4);
      (*OpenGLFuncs.glTexCoord2f)(fVar11,fVar14);
      (*OpenGLFuncs.glVertex2i)(iVar3,iVar9);
      (*OpenGLFuncs.glTexCoord2f)(fVar13,fVar14);
      (*OpenGLFuncs.glVertex2i)(iVar8,iVar9);
      (*OpenGLFuncs.glEnd)();
    }
  }
  return;
}

Assistant:

SDLCALL
SDL_GL_UpdateRects(int numrects, SDL12_Rect *rects12)
{
    if (OpenGLBlitTexture) {
        const int srcpitch = VideoSurface12->pitch;
        const int pixsize = VideoSurface12->format->BytesPerPixel;
        const GLenum glfmt = (pixsize == 4) ? GL_RGBA : GL_RGB;
        const GLenum gltype = (pixsize == 4) ? GL_UNSIGNED_BYTE : GL_UNSIGNED_SHORT_5_6_5;
        SDL_Rect surfacerect20;
        int i;

        surfacerect20.x = surfacerect20.y = 0;
        surfacerect20.w = VideoSurface12->w;
        surfacerect20.h = VideoSurface12->h;

        for (i = 0; i < numrects; i++) {
            SDL_Rect rect20;
            SDL_Rect intersected20;
            Uint8 *src;

            SDL20_IntersectRect(Rect12to20(&rects12[i], &rect20), &surfacerect20, &intersected20);

            src = (((Uint8 *) VideoSurface12->pixels) + (intersected20.y * srcpitch)) + (intersected20.x * pixsize);
            OpenGLFuncs.glTexSubImage2D(GL_TEXTURE_2D, 0, intersected20.x, intersected20.y, intersected20.w, intersected20.h, glfmt, gltype, src);

            OpenGLFuncs.glBegin(GL_TRIANGLE_STRIP);
            {
                const GLfloat tex_x1 = ((GLfloat) intersected20.x) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y1 = ((GLfloat) intersected20.y) / ((GLfloat) VideoSurface12->h);
                const GLfloat tex_x2 = tex_x1 + ((GLfloat) intersected20.w) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y2 = tex_y1 + ((GLfloat) intersected20.h) / ((GLfloat) VideoSurface12->h);
                const GLint vert_x1 = (GLint) intersected20.x;
                const GLint vert_y1 = (GLint) intersected20.y;
                const GLint vert_x2 = vert_x1 + (GLint) intersected20.w;
                const GLint vert_y2 = vert_y1 + (GLint) intersected20.h;
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y2);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y2);
            }
            OpenGLFuncs.glEnd();
        }
    }
}